

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O2

int fy_parse_strncmp(fy_parser *fyp,char *str,size_t n)

{
  int iVar1;
  uint uVar2;
  char *__s1;
  
  __s1 = (char *)fy_ensure_lookahead(fyp,n,(size_t *)0x0);
  if (__s1 == (char *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    iVar1 = strncmp(__s1,str,n);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static inline int fy_parse_strncmp(struct fy_parser *fyp, const char *str, size_t n) {
    const char *p;
    int ret;

    p = fy_ensure_lookahead(fyp, n, NULL);
    if (!p)
        return -1;
    ret = strncmp(p, str, n);
    return ret ? 1 : 0;
}